

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O2

int SUNSPBCGSSetPrecType(SUNLinearSolver S,int pretype)

{
  int iVar1;
  
  if ((uint)pretype < 4) {
    if (S != (SUNLinearSolver)0x0) {
      *(int *)((long)S->content + 4) = pretype;
      return 0;
    }
    iVar1 = -1;
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

SUNDIALS_EXPORT int SUNLinSol_SPBCGSSetPrecType(SUNLinearSolver S, int pretype) 
{
  /* Check for legal pretype */ 
  if ((pretype != PREC_NONE)  && (pretype != PREC_LEFT) &&
      (pretype != PREC_RIGHT) && (pretype != PREC_BOTH)) {
    return(SUNLS_ILL_INPUT);
  }

  /* Check for non-NULL SUNLinearSolver */
  if (S == NULL) return(SUNLS_MEM_NULL);

  /* Set pretype */
  PRETYPE(S) = pretype;
  return(SUNLS_SUCCESS);
}